

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac.c
# Opt level: O2

int mac_method_hmac_sha1_96_hash
              (LIBSSH2_SESSION *session,uchar *buf,uint32_t seqno,uchar *packet,size_t packet_len,
              uchar *addtl,size_t addtl_len,void **abstract)

{
  int iVar1;
  uchar temp [20];
  
  iVar1 = mac_method_hmac_sha1_hash(session,temp,seqno,packet,packet_len,addtl,addtl_len,abstract);
  if (iVar1 == 0) {
    *(undefined4 *)(buf + 8) = temp._8_4_;
    *(undefined8 *)buf = temp._0_8_;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

static int
mac_method_hmac_sha1_96_hash(LIBSSH2_SESSION * session,
                             unsigned char *buf, uint32_t seqno,
                             const unsigned char *packet,
                             size_t packet_len,
                             const unsigned char *addtl,
                             size_t addtl_len, void **abstract)
{
    unsigned char temp[SHA_DIGEST_LENGTH];

    if(mac_method_hmac_sha1_hash(session, temp, seqno, packet, packet_len,
                                 addtl, addtl_len, abstract))
        return 1;

    memcpy(buf, (char *) temp, 96 / 8);
    return 0;
}